

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O2

Gia_Man_t * Gia_ManDupNormalize(Gia_Man_t *p,int fHashMapping)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  int v;
  int v_00;
  int iVar6;
  
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  p->pObjs->Value = 0;
  iVar1 = Gia_ManIsSeqWithBoxes(p);
  if (iVar1 == 0) {
    iVar1 = 0;
    while ((iVar1 < p->vCis->nSize && (pGVar5 = Gia_ManCi(p,iVar1), pGVar5 != (Gia_Obj_t *)0x0))) {
      uVar3 = Gia_ManAppendCi(p_00);
      pGVar5->Value = uVar3;
      iVar1 = iVar1 + 1;
    }
  }
  else {
    iVar1 = Tim_ManPiNum((Tim_Man_t *)p->pManTime);
    iVar2 = Tim_ManCiNum((Tim_Man_t *)p->pManTime);
    if (iVar2 != p->vCis->nSize) {
      __assert_fail("nAll == Gia_ManCiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                    ,0xa1,"Gia_Man_t *Gia_ManDupNormalize(Gia_Man_t *, int)");
    }
    iVar6 = iVar1 - p->nRegs;
    if (iVar6 < 1) {
      __assert_fail("nPis > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                    ,0xa2,"Gia_Man_t *Gia_ManDupNormalize(Gia_Man_t *, int)");
    }
    for (v = 0; v_00 = iVar1, iVar6 != v; v = v + 1) {
      uVar3 = Gia_ManAppendCi(p_00);
      pGVar5 = Gia_ManCi(p,v);
      pGVar5->Value = uVar3;
    }
    for (; v_00 < iVar2; v_00 = v_00 + 1) {
      uVar3 = Gia_ManAppendCi(p_00);
      pGVar5 = Gia_ManCi(p,v_00);
      pGVar5->Value = uVar3;
    }
    for (iVar2 = iVar1 - p->nRegs; iVar2 < iVar1; iVar2 = iVar2 + 1) {
      uVar3 = Gia_ManAppendCi(p_00);
      pGVar5 = Gia_ManCi(p,iVar2);
      pGVar5->Value = uVar3;
    }
    puts("Warning: Shuffled CI order to be correct sequential AIG.");
  }
  if (fHashMapping != 0) {
    Gia_ManHashAlloc(p_00);
  }
  iVar1 = 0;
  while ((iVar1 < p->nObjs && (pGVar5 = Gia_ManObj(p,iVar1), pGVar5 != (Gia_Obj_t *)0x0))) {
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar2 = Gia_ObjIsBuf(pGVar5);
      iVar6 = Gia_ObjFanin0Copy(pGVar5);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjFanin1Copy(pGVar5);
        if (fHashMapping == 0) {
          uVar3 = Gia_ManAppendAnd(p_00,iVar6,iVar2);
        }
        else {
          uVar3 = Gia_ManHashAnd(p_00,iVar6,iVar2);
        }
      }
      else {
        uVar3 = Gia_ManAppendBuf(p_00,iVar6);
      }
      pGVar5->Value = uVar3;
    }
    iVar1 = iVar1 + 1;
  }
  if (fHashMapping != 0) {
    Gia_ManHashStop(p_00);
  }
  iVar1 = 0;
  while ((iVar1 < p->vCos->nSize && (pGVar5 = Gia_ManCo(p,iVar1), pGVar5 != (Gia_Obj_t *)0x0))) {
    iVar2 = Gia_ObjFanin0Copy(pGVar5);
    uVar3 = Gia_ManAppendCo(p_00,iVar2);
    pGVar5->Value = uVar3;
    iVar1 = iVar1 + 1;
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  p_00->nConstrs = p->nConstrs;
  iVar1 = Gia_ManIsNormalized(p_00);
  if (iVar1 == 0) {
    __assert_fail("Gia_ManIsNormalized(pNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                  ,0xbb,"Gia_Man_t *Gia_ManDupNormalize(Gia_Man_t *, int)");
  }
  Gia_ManDupRemapEquiv(p_00,p);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupNormalize( Gia_Man_t * p, int fHashMapping )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    if ( !Gia_ManIsSeqWithBoxes(p) )
    {
        Gia_ManForEachCi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi(pNew);
    }
    else
    {
        // current CI order:  PIs + FOs + NewCIs
        // desired reorder:   PIs + NewCIs + FOs
        int nCIs = Tim_ManPiNum( (Tim_Man_t *)p->pManTime );
        int nAll = Tim_ManCiNum( (Tim_Man_t *)p->pManTime );
        int nPis = nCIs - Gia_ManRegNum(p);
        assert( nAll == Gia_ManCiNum(p) );
        assert( nPis > 0 );
        // copy PIs first
        for ( i = 0; i < nPis; i++ )
            Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
       // copy new CIs second
        for ( i = nCIs; i < nAll; i++ )
            Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
        // copy flops last
        for ( i = nCIs - Gia_ManRegNum(p); i < nCIs; i++ )
            Gia_ManCi(p, i)->Value = Gia_ManAppendCi(pNew);
        printf( "Warning: Shuffled CI order to be correct sequential AIG.\n" );
    }
    if ( fHashMapping ) Gia_ManHashAlloc( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( fHashMapping )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    if ( fHashMapping ) Gia_ManHashStop( pNew );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew->nConstrs = p->nConstrs;
    assert( Gia_ManIsNormalized(pNew) );
    Gia_ManDupRemapEquiv( pNew, p );
    return pNew;
}